

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdsplitter.cpp
# Opt level: O2

void __thiscall mdsplit::mdsplitter::run_update_links(mdsplitter *this)

{
  path *base;
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  pointer pcVar4;
  bool bVar5;
  ostream *poVar6;
  difference_type dVar7;
  byte bVar8;
  pointer pmVar9;
  long lVar10;
  pointer __re;
  size_type sVar11;
  string *psVar12;
  __normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>
  __it;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer str;
  pointer psVar13;
  __normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>
  this_01;
  long lVar14;
  ulong uVar15;
  initializer_list<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>
  __l;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  smatch matches;
  string url;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  path relative_url_1;
  path relative_url;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_118;
  undefined8 local_f8;
  pointer local_f0;
  pointer local_e8;
  pointer local_e0;
  pointer local_d8;
  long local_d0;
  vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>_>
  url_regexes;
  string header_slug;
  regex second_order_url_or_img_regex;
  regex url_or_img_regex;
  string local_50;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&url_or_img_regex,"\\[([^\\[\\]]*)\\]\\(([^\\)]*)\\)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&second_order_url_or_img_regex,
             "\\[(!?)\\[([^\\[\\]]*)\\]\\(([^\\)]*)\\)\\]\\(([^\\)]*)\\)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&relative_url,&url_or_img_regex
            );
  relative_url._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x2;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_118,&second_order_url_or_img_regex);
  local_f8 = 4;
  __l._M_len = 2;
  __l._M_array = (iterator)&relative_url;
  std::
  vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>_>
  ::vector(&url_regexes,__l,(allocator_type *)&relative_url_1);
  lVar10 = 0x28;
  do {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               ((long)&relative_url._M_pathname._M_dataplus._M_p + lVar10));
    lVar10 = lVar10 + -0x28;
  } while (lVar10 != -0x28);
  local_f0 = url_regexes.
             super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  __re = url_regexes.
         super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__re == local_f0) {
      std::
      vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>_>
      ::~vector(&url_regexes);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                (&second_order_url_or_img_regex);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                (&url_or_img_regex);
      return;
    }
    local_e8 = (this->sections_).
               super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    pmVar9 = (this->sections_).
             super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl.
             super__Vector_impl_data._M_start;
    while (pmVar9 != local_e8) {
      local_d8 = (pmVar9->lines).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      base = &pmVar9->filepath;
      bVar8 = 0;
      local_e0 = pmVar9;
      for (str = (pmVar9->lines).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; str != local_d8; str = str + 1) {
        bVar5 = is_codeblock(str);
        bVar8 = bVar8 ^ bVar5;
        if (bVar8 == 0) {
          matches.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          matches._M_begin._M_current = (char *)0x0;
          matches.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          matches.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1d8._M_current = (str->_M_dataplus)._M_p;
          local_170._M_current = local_1d8._M_current + str->_M_string_length;
          do {
            bVar5 = std::__detail::
                    __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                              (local_1d8,local_170,&matches,&__re->first,0);
            if (!bVar5) break;
            local_d0 = (long)local_1d8._M_current - (long)(str->_M_dataplus)._M_p;
            lVar10 = (long)matches.
                           super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)matches.
                           super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            if ((lVar10 == 0) || (lVar10 / 0x18 - 3U <= __re->second)) {
              this_00 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)matches.
                                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar10 + -0x48);
            }
            else {
              this_00 = matches.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + __re->second;
            }
            std::__cxx11::
            sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::str(&url,this_00);
            bVar5 = is_external(&url);
            if (bVar5) {
              sVar11 = url._M_string_length;
              if (this->trace_ == true) {
                poVar6 = std::operator<<((ostream *)&std::cout,(string *)&url);
                poVar6 = std::operator<<(poVar6," <- (external)");
                std::endl<char,std::char_traits<char>>(poVar6);
                sVar11 = url._M_string_length;
              }
            }
            else {
              lVar10 = std::__cxx11::string::rfind((char)&url,0x23);
              if (lVar10 == 0) {
                std::__cxx11::string::substr((ulong)&header_slug,(ulong)&url);
                __it._M_current =
                     (this->sections_).
                     super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>.
                     _M_impl.super__Vector_impl_data._M_start;
                pmVar9 = (this->sections_).
                         super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                lVar10 = (long)pmVar9 - (long)__it._M_current;
                relative_url._M_pathname._M_dataplus._M_p = (pointer)&header_slug;
                for (lVar14 = lVar10 >> 9; 0 < lVar14; lVar14 = lVar14 + -1) {
                  bVar5 = __gnu_cxx::__ops::_Iter_pred<mdsplit::mdsplitter::run_update_links()::$_0>
                          ::operator()((_Iter_pred<mdsplit::mdsplitter::run_update_links()::__0> *)
                                       &relative_url,__it);
                  this_01._M_current = __it._M_current;
                  if (bVar5) goto LAB_00120724;
                  bVar5 = __gnu_cxx::__ops::_Iter_pred<mdsplit::mdsplitter::run_update_links()::$_0>
                          ::operator()((_Iter_pred<mdsplit::mdsplitter::run_update_links()::__0> *)
                                       &relative_url,__it._M_current + 1);
                  this_01._M_current = __it._M_current + 1;
                  if (bVar5) goto LAB_00120724;
                  bVar5 = __gnu_cxx::__ops::_Iter_pred<mdsplit::mdsplitter::run_update_links()::$_0>
                          ::operator()((_Iter_pred<mdsplit::mdsplitter::run_update_links()::__0> *)
                                       &relative_url,__it._M_current + 2);
                  this_01._M_current = __it._M_current + 2;
                  if (bVar5) goto LAB_00120724;
                  bVar5 = __gnu_cxx::__ops::_Iter_pred<mdsplit::mdsplitter::run_update_links()::$_0>
                          ::operator()((_Iter_pred<mdsplit::mdsplitter::run_update_links()::__0> *)
                                       &relative_url,__it._M_current + 3);
                  this_01._M_current = __it._M_current + 3;
                  if (bVar5) goto LAB_00120724;
                  __it._M_current = __it._M_current + 4;
                  lVar10 = lVar10 + -0x200;
                }
                lVar10 = lVar10 >> 7;
                if (lVar10 == 1) {
LAB_0012070b:
                  bVar5 = __gnu_cxx::__ops::_Iter_pred<mdsplit::mdsplitter::run_update_links()::$_0>
                          ::operator()((_Iter_pred<mdsplit::mdsplitter::run_update_links()::__0> *)
                                       &relative_url,__it);
                  this_01._M_current = pmVar9;
                  if (bVar5) {
                    this_01._M_current = __it._M_current;
                  }
                }
                else if (lVar10 == 2) {
LAB_001206ee:
                  bVar5 = __gnu_cxx::__ops::_Iter_pred<mdsplit::mdsplitter::run_update_links()::$_0>
                          ::operator()((_Iter_pred<mdsplit::mdsplitter::run_update_links()::__0> *)
                                       &relative_url,__it);
                  this_01._M_current = __it._M_current;
                  if (!bVar5) {
                    __it._M_current = __it._M_current + 1;
                    goto LAB_0012070b;
                  }
                }
                else {
                  this_01._M_current = pmVar9;
                  if ((lVar10 == 3) &&
                     (bVar5 = __gnu_cxx::__ops::
                              _Iter_pred<mdsplit::mdsplitter::run_update_links()::$_0>::operator()
                                        ((_Iter_pred<mdsplit::mdsplitter::run_update_links()::__0> *
                                         )&relative_url,__it), this_01._M_current = __it._M_current,
                     !bVar5)) {
                    __it._M_current = __it._M_current + 1;
                    goto LAB_001206ee;
                  }
                }
LAB_00120724:
                if (this_01._M_current ==
                    (this->sections_).
                    super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
LAB_00120833:
                  sVar11 = url._M_string_length;
                  if (this->trace_ == true) {
                    poVar6 = std::operator<<((ostream *)&std::cout,"Cannot find file for a header ")
                    ;
                    poVar6 = std::operator<<(poVar6,(string *)&url);
                    poVar6 = std::operator<<(poVar6," whose slug is ");
                    poVar6 = std::operator<<(poVar6,(string *)&header_slug);
                    std::endl<char,std::char_traits<char>>(poVar6);
                    sVar11 = url._M_string_length;
                  }
                }
                else {
                  bVar5 = mdsection::has_content(this_01._M_current,false,false);
                  if (this_01._M_current + !bVar5 ==
                      (this->sections_).
                      super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>.
                      _M_impl.super__Vector_impl_data._M_finish) goto LAB_00120833;
                  std::filesystem::current_path_abi_cxx11_();
                  std::filesystem::__cxx11::operator/
                            (&relative_url,&relative_url_1,&this_01._M_current[!bVar5].filepath);
                  std::filesystem::__cxx11::path::~path(&relative_url_1);
                  relative_path(&relative_url_1,this,&relative_url,base);
                  if (this->trace_ == true) {
                    poVar6 = std::operator<<((ostream *)&std::cout,(string *)&url);
                    poVar6 = std::operator<<(poVar6,"->");
                    poVar6 = std::operator<<(poVar6,relative_url_1._M_pathname._M_dataplus._M_p);
                    std::endl<char,std::char_traits<char>>(poVar6);
                  }
                  pcVar4 = (str->_M_dataplus)._M_p;
                  dVar7 = std::__cxx11::
                          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ::position(&matches,__re->second);
                  lVar10 = (long)matches.
                                 super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)matches.
                                 super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  if ((lVar10 == 0) || (lVar10 / 0x18 - 3U <= __re->second)) {
                    psVar13 = (pointer)((long)matches.
                                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start +
                                       lVar10 + -0x48);
                  }
                  else {
                    psVar13 = matches.
                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + __re->second;
                  }
                  bVar5 = psVar13->matched;
                  pcVar1 = (psVar13->
                           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ).first._M_current;
                  pcVar2 = (psVar13->
                           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ).second._M_current;
                  std::filesystem::__cxx11::path::string(&local_50,&relative_url_1);
                  psVar12 = (string *)(pcVar2 + -(long)pcVar1);
                  if (bVar5 == false) {
                    psVar12 = (string *)0x0;
                  }
                  std::__cxx11::string::replace
                            ((ulong)str,(ulong)(local_1d8._M_current + (dVar7 - (long)pcVar4)),
                             psVar12);
                  std::__cxx11::string::~string((string *)&local_50);
                  std::filesystem::__cxx11::path::string(&local_50,&relative_url_1);
                  sVar11 = local_50._M_string_length;
                  std::__cxx11::string::~string((string *)&local_50);
                  std::filesystem::__cxx11::path::~path(&relative_url_1);
                  std::filesystem::__cxx11::path::~path(&relative_url);
                }
                std::__cxx11::string::~string((string *)&header_slug);
              }
              else {
                lVar10 = std::__cxx11::string::rfind((char *)&url,0x12906d);
                if (lVar10 == 0) {
                  std::__cxx11::string::erase(&url,url._M_dataplus._M_p,url._M_dataplus._M_p + 2);
                }
                std::filesystem::__cxx11::path::
                path<std::__cxx11::string,std::filesystem::__cxx11::path>
                          (&relative_url_1,&url,auto_format);
                relative_path(&relative_url,this,&relative_url_1,base);
                std::filesystem::__cxx11::path::~path(&relative_url_1);
                if (this->trace_ == true) {
                  poVar6 = std::operator<<((ostream *)&std::cout,
                                           (base->_M_pathname)._M_dataplus._M_p);
                  poVar6 = std::operator<<(poVar6,": ");
                  poVar6 = std::operator<<(poVar6,(string *)&url);
                  poVar6 = std::operator<<(poVar6," -> ");
                  poVar6 = std::operator<<(poVar6,relative_url._M_pathname._M_dataplus._M_p);
                  std::endl<char,std::char_traits<char>>(poVar6);
                }
                pcVar4 = (str->_M_dataplus)._M_p;
                dVar7 = std::__cxx11::
                        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ::position(&matches,__re->second);
                lVar10 = (long)matches.
                               super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)matches.
                               super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                if ((lVar10 == 0) || (lVar10 / 0x18 - 3U <= __re->second)) {
                  psVar13 = (pointer)((long)matches.
                                            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                     lVar10 + -0x48);
                }
                else {
                  psVar13 = matches.
                            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + __re->second;
                }
                bVar5 = psVar13->matched;
                pcVar1 = (psVar13->
                         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ).first._M_current;
                pcVar2 = (psVar13->
                         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ).second._M_current;
                std::filesystem::__cxx11::path::string(&relative_url_1._M_pathname,&relative_url);
                psVar12 = (string *)(pcVar2 + -(long)pcVar1);
                if (bVar5 == false) {
                  psVar12 = (string *)0x0;
                }
                std::__cxx11::string::replace
                          ((ulong)str,(ulong)(local_1d8._M_current + (dVar7 - (long)pcVar4)),psVar12
                          );
                std::__cxx11::string::~string((string *)&relative_url_1);
                std::filesystem::__cxx11::path::string(&relative_url_1._M_pathname,&relative_url);
                sVar11 = relative_url_1._M_pathname._M_string_length;
                std::__cxx11::string::~string((string *)&relative_url_1);
                std::filesystem::__cxx11::path::~path(&relative_url);
              }
            }
            uVar3 = __re->second;
            if (sVar11 == 0) {
              lVar10 = (long)matches.
                             super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)matches.
                             super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              if ((lVar10 == 0) || (lVar10 / 0x18 - 3U <= uVar3)) {
                psVar13 = (pointer)((long)matches.
                                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          .
                                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar10 + -0x48
                                   );
              }
              else {
                psVar13 = matches.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar3;
              }
              sVar11 = (long)(psVar13->
                             super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ).second._M_current -
                       (long)(psVar13->
                             super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ).first._M_current;
              if (psVar13->matched == false) {
                sVar11 = 0;
              }
            }
            dVar7 = std::__cxx11::
                    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::position(&matches,uVar3);
            uVar15 = local_d0 + sVar11 + dVar7;
            uVar3 = str->_M_string_length;
            if (uVar15 < uVar3) {
              pcVar4 = (str->_M_dataplus)._M_p;
              local_1d8._M_current = pcVar4 + uVar15;
              local_170._M_current = pcVar4 + uVar3;
            }
            std::__cxx11::string::~string((string *)&url);
          } while (uVar15 < uVar3);
          std::
          _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&matches);
        }
      }
      pmVar9 = local_e0 + 1;
    }
    __re = __re + 1;
  } while( true );
}

Assistant:

void mdsplitter::run_update_links() {
        // [some text](URL) -> std::regex{R"([^!]*\[(.*)\]\((.*)\))"};
        // ![some text](URL) -> std::regex{R"(!\[(.*)\]\((.*)\))"};
        std::regex url_or_img_regex{R"(\[([^\[\]]*)\]\(([^\)]*)\))"};

        // [![example_area_1](docs/examples/line_plot/area/area_1.svg)](examples/line_plot/area/area_1.cpp)
        std::regex second_order_url_or_img_regex{
            R"(\[(!?)\[([^\[\]]*)\]\(([^\)]*)\)\]\(([^\)]*)\))"};

        std::vector<std::pair<std::regex, size_t>> url_regexes = {
            {url_or_img_regex, 2}, {second_order_url_or_img_regex, 4}};

        for (const auto &[url_regex, url_idx] : url_regexes) {
            for (auto &section : sections_) {
                bool in_codeblock = false;
                for (auto &line : section.lines) {
                    if (is_codeblock(line)) {
                        in_codeblock = 1 - in_codeblock;
                    }
                    if (in_codeblock) {
                        continue;
                    }
                    std::smatch matches;
                    auto line_begin = line.cbegin();
                    auto line_end = line.cend();
                    size_t replacement_size = 0;
                    while (std::regex_search(line_begin, line_end, matches,
                                             url_regex)) {
                        size_t line_begin_pos = line_begin - line.cbegin();
                        std::string url = matches[url_idx];
                        if (!is_external(url)) {
                            bool is_anchor = url.rfind('#', 0) == 0;
                            if (!is_anchor) {
                                bool is_single_dot_directory =
                                    url.rfind("./", 0) == 0;
                                if (is_single_dot_directory) {
                                    url.erase(url.begin(), url.begin() + 2);
                                }
                                fs::path relative_url =
                                    relative_path(url, section.filepath);
                                if (trace_) {
                                    std::cout << section.filepath.c_str()
                                              << ": " << url << " -> "
                                              << relative_url.c_str()
                                              << std::endl;
                                }
                                size_t pos =
                                    std::distance(line.cbegin(), line_begin) +
                                    matches.position(url_idx);
                                line.replace(pos, matches[url_idx].length(),
                                             relative_url.string());
                                replacement_size = relative_url.string().size();
                            } else {
                                // look for section
                                std::string header_slug = url.substr(1);
                                auto it = std::find_if(
                                    sections_.begin(), sections_.end(),
                                    [&](const mdsection &s) {
                                        return slugify(s.header_name) ==
                                               header_slug;
                                    });

                                // if it's a empty section, point to next
                                // section this is important for empty
                                // categories for which mkdocs creates no links
                                if (it != sections_.end()) {
                                    if (!it->has_content()) {
                                        ++it;
                                    }
                                }

                                // if link to valid section
                                if (it != sections_.end()) {
                                    fs::path absolute_destination =
                                        fs::current_path() / it->filepath;
                                    fs::path relative_url = relative_path(
                                        absolute_destination, section.filepath);
                                    if (trace_) {
                                        std::cout << url << "->"
                                                  << relative_url.c_str()
                                                  << std::endl;
                                    }
                                    size_t pos = std::distance(line.cbegin(),
                                                               line_begin) +
                                                 matches.position(url_idx);
                                    line.replace(pos, matches[url_idx].length(),
                                                 relative_url.string());
                                    replacement_size =
                                        relative_url.string().size();
                                } else {
                                    // not link to a valid section
                                    // we hope we didn't get here
                                    if (trace_) {
                                        std::cout
                                            << "Cannot find file for a header "
                                            << url << " whose slug is "
                                            << header_slug << std::endl;
                                    }
                                    replacement_size = url.size();
                                }
                            }
                        } else {
                            if (trace_) {
                                std::cout << url << " <- (external)"
                                          << std::endl;
                            }
                            replacement_size = url.size();
                        }
                        if (replacement_size == 0) {
                            replacement_size = matches[url_idx].length();
                        }
                        size_t new_begin_pos = line_begin_pos +
                                               matches.position(url_idx) +
                                               replacement_size;
                        if (new_begin_pos < line.size()) {
                            line_begin = line.cbegin() + new_begin_pos;
                            line_end = line.cend();
                        } else {
                            break;
                        }
                    }
                }
            }
        }
    }